

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_cc_cond(DisasCompare_conflict *c,DisasContext_conflict2 *s,int cond)

{
  CCOp_conflict CVar1;
  TCGContext_conflict2 *tcg_ctx;
  TCGCond TVar2;
  TCGv_i32 pTVar3;
  TCGTemp *pTVar4;
  TCGv_i32 pTVar5;
  TCGTemp *ts;
  
  tcg_ctx = s->uc->tcg_ctx;
  CVar1 = s->cc_op;
  if (CVar1 - CC_OP_CMPB < 3) {
    c->g1 = true;
    c->g2 = true;
    c->v1 = QREG_CC_N;
    c->v2 = QREG_CC_V;
    switch(cond) {
    case 2:
    case 3:
      TVar2 = TCG_COND_LEU;
      break;
    case 4:
    case 5:
      TVar2 = TCG_COND_LTU;
      break;
    case 6:
    case 7:
      goto switchD_00702c10_caseD_6;
    default:
      goto switchD_00702c10_caseD_8;
    case 10:
    case 0xb:
      c->g1 = false;
      c->g2 = false;
      pTVar3 = tcg_const_i32_m68k(tcg_ctx,0);
      c->v2 = pTVar3;
      pTVar4 = tcg_temp_new_internal_m68k(tcg_ctx,TCG_TYPE_I32,false);
      pTVar3 = (TCGv_i32)((long)pTVar4 - (long)tcg_ctx);
      c->v1 = pTVar3;
      tcg_gen_sub_i32(tcg_ctx,pTVar3,QREG_CC_N,QREG_CC_V);
      if (CVar1 != CC_OP_CMPL) {
        if (CVar1 == CC_OP_CMPW) {
          tcg_gen_ext16s_i32_m68k(tcg_ctx,pTVar3,pTVar3);
        }
        else {
          if (CVar1 != CC_OP_CMPB) {
            g_assertion_message_expr
                      ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/m68k/translate.c"
                       ,0x24c,(char *)0x0);
          }
          tcg_gen_ext8s_i32_m68k(tcg_ctx,pTVar3,pTVar3);
        }
      }
    case 0xc:
    case 0xd:
switchD_00702c10_caseD_c:
      TVar2 = TCG_COND_LT;
      break;
    case 0xe:
    case 0xf:
switchD_00702c10_caseD_e:
      TVar2 = TCG_COND_LE;
    }
  }
  else {
switchD_00702c10_caseD_8:
    c->g1 = true;
    c->g2 = false;
    pTVar3 = tcg_const_i32_m68k(tcg_ctx,0);
    c->v2 = pTVar3;
    switch(cond) {
    default:
      goto switchD_00702c4a_caseD_2;
    case 4:
    case 5:
      pTVar5 = QREG_CC_X;
      if (5 < CVar1 - CC_OP_ADDB) goto switchD_00702c4a_caseD_8;
      goto LAB_00702dff;
    case 6:
    case 7:
      pTVar3 = QREG_CC_N;
      if ((5 < CVar1 - CC_OP_ADDB) && (CVar1 != CC_OP_LOGIC)) goto switchD_00702c4a_caseD_2;
      goto LAB_00702de4;
    case 8:
    case 9:
switchD_00702c4a_caseD_8:
      if (CVar1 != CC_OP_LOGIC) goto switchD_00702c4a_caseD_2;
    case 0:
    case 1:
      c->v1 = pTVar3;
      TVar2 = TCG_COND_NEVER;
      break;
    case 10:
    case 0xb:
      if (5 < CVar1 - CC_OP_ADDB) goto switchD_00702c4a_caseD_c;
      goto switchD_00702d74_caseD_a;
    case 0xc:
    case 0xd:
switchD_00702c4a_caseD_c:
      if (CVar1 != CC_OP_LOGIC) goto switchD_00702c4a_caseD_2;
switchD_00702d74_caseD_a:
      pTVar3 = QREG_CC_N;
LAB_00702dd2:
      c->v1 = pTVar3;
      goto switchD_00702c10_caseD_c;
    case 0xe:
    case 0xf:
      if (CVar1 == CC_OP_LOGIC) {
        c->v1 = QREG_CC_N;
        goto switchD_00702c10_caseD_e;
      }
switchD_00702c4a_caseD_2:
      gen_flush_flags(s);
      switch(cond) {
      case 2:
      case 3:
        pTVar4 = tcg_temp_new_internal_m68k(tcg_ctx,TCG_TYPE_I32,false);
        c->v1 = (TCGv_i32)((long)pTVar4 - (long)tcg_ctx);
        c->g1 = false;
        tcg_gen_setcond_i32_m68k
                  (tcg_ctx,TCG_COND_EQ,(TCGv_i32)((long)pTVar4 - (long)tcg_ctx),QREG_CC_Z,c->v2);
        tcg_gen_op3_m68k(tcg_ctx,INDEX_op_or_i32,(TCGArg)pTVar4,(TCGArg)pTVar4,
                         (TCGArg)(QREG_CC_C + (long)tcg_ctx));
        break;
      case 4:
      case 5:
        pTVar5 = QREG_CC_C;
LAB_00702dff:
        c->v1 = pTVar5;
        break;
      case 6:
      case 7:
        pTVar3 = QREG_CC_Z;
LAB_00702de4:
        c->v1 = pTVar3;
switchD_00702c10_caseD_6:
        TVar2 = TCG_COND_EQ;
        goto LAB_00702e08;
      case 8:
      case 9:
        pTVar3 = QREG_CC_V;
        goto LAB_00702dd2;
      case 10:
      case 0xb:
        goto switchD_00702d74_caseD_a;
      case 0xc:
      case 0xd:
        pTVar4 = tcg_temp_new_internal_m68k(tcg_ctx,TCG_TYPE_I32,false);
        c->v1 = (TCGv_i32)((long)pTVar4 - (long)tcg_ctx);
        c->g1 = false;
        tcg_gen_op3_m68k(tcg_ctx,INDEX_op_xor_i32,(TCGArg)pTVar4,(TCGArg)(QREG_CC_N + (long)tcg_ctx)
                         ,(TCGArg)(QREG_CC_V + (long)tcg_ctx));
        goto switchD_00702c10_caseD_c;
      case 0xe:
      case 0xf:
        pTVar4 = tcg_temp_new_internal_m68k(tcg_ctx,TCG_TYPE_I32,false);
        c->v1 = (TCGv_i32)((long)pTVar4 - (long)tcg_ctx);
        c->g1 = false;
        tcg_gen_setcond_i32_m68k
                  (tcg_ctx,TCG_COND_EQ,(TCGv_i32)((long)pTVar4 - (long)tcg_ctx),QREG_CC_Z,c->v2);
        tcg_gen_op2_m68k(tcg_ctx,INDEX_op_neg_i32,(TCGArg)pTVar4,(TCGArg)pTVar4);
        ts = tcg_temp_new_internal_m68k(tcg_ctx,TCG_TYPE_I32,false);
        tcg_gen_op3_m68k(tcg_ctx,INDEX_op_xor_i32,(TCGArg)ts,(TCGArg)(QREG_CC_N + (long)tcg_ctx),
                         (TCGArg)(QREG_CC_V + (long)tcg_ctx));
        tcg_gen_op3_m68k(tcg_ctx,INDEX_op_or_i32,(TCGArg)pTVar4,(TCGArg)pTVar4,(TCGArg)ts);
        tcg_temp_free_internal_m68k(tcg_ctx,ts);
        goto switchD_00702c10_caseD_c;
      default:
        abort();
      }
      TVar2 = TCG_COND_NE;
    }
  }
LAB_00702e08:
  c->tcond = cond & TCG_COND_ALWAYS ^ TVar2 ^ TCG_COND_ALWAYS;
  return;
}

Assistant:

static void gen_cc_cond(DisasCompare *c, DisasContext *s, int cond)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv tmp, tmp2;
    TCGCond tcond;
    CCOp op = s->cc_op;

    /* The CC_OP_CMP form can handle most normal comparisons directly.  */
    if (op == CC_OP_CMPB || op == CC_OP_CMPW || op == CC_OP_CMPL) {
        c->g1 = c->g2 = 1;
        c->v1 = QREG_CC_N;
        c->v2 = QREG_CC_V;
        switch (cond) {
        case 2: /* HI */
        case 3: /* LS */
            tcond = TCG_COND_LEU;
            goto done;
        case 4: /* CC */
        case 5: /* CS */
            tcond = TCG_COND_LTU;
            goto done;
        case 6: /* NE */
        case 7: /* EQ */
            tcond = TCG_COND_EQ;
            goto done;
        case 10: /* PL */
        case 11: /* MI */
            c->g1 = c->g2 = 0;
            c->v2 = tcg_const_i32(tcg_ctx, 0);
            c->v1 = tmp = tcg_temp_new(tcg_ctx);
            tcg_gen_sub_i32(tcg_ctx, tmp, QREG_CC_N, QREG_CC_V);
            gen_ext(tcg_ctx, tmp, tmp, op - CC_OP_CMPB, 1);
            /* fallthru */
        case 12: /* GE */
        case 13: /* LT */
            tcond = TCG_COND_LT;
            goto done;
        case 14: /* GT */
        case 15: /* LE */
            tcond = TCG_COND_LE;
            goto done;
        }
    }

    c->g1 = 1;
    c->g2 = 0;
    c->v2 = tcg_const_i32(tcg_ctx, 0);

    switch (cond) {
    case 0: /* T */
    case 1: /* F */
        c->v1 = c->v2;
        tcond = TCG_COND_NEVER;
        goto done;
    case 14: /* GT (!(Z || (N ^ V))) */
    case 15: /* LE (Z || (N ^ V)) */
        /*
         * Logic operations clear V, which simplifies LE to (Z || N),
         * and since Z and N are co-located, this becomes a normal
         * comparison vs N.
         */
        if (op == CC_OP_LOGIC) {
            c->v1 = QREG_CC_N;
            tcond = TCG_COND_LE;
            goto done;
        }
        break;
    case 12: /* GE (!(N ^ V)) */
    case 13: /* LT (N ^ V) */
        /* Logic operations clear V, which simplifies this to N.  */
        if (op != CC_OP_LOGIC) {
            break;
        }
        /* fallthru */
    case 10: /* PL (!N) */
    case 11: /* MI (N) */
        /* Several cases represent N normally.  */
        if (op == CC_OP_ADDB || op == CC_OP_ADDW || op == CC_OP_ADDL ||
            op == CC_OP_SUBB || op == CC_OP_SUBW || op == CC_OP_SUBL ||
            op == CC_OP_LOGIC) {
            c->v1 = QREG_CC_N;
            tcond = TCG_COND_LT;
            goto done;
        }
        break;
    case 6: /* NE (!Z) */
    case 7: /* EQ (Z) */
        /* Some cases fold Z into N.  */
        if (op == CC_OP_ADDB || op == CC_OP_ADDW || op == CC_OP_ADDL ||
            op == CC_OP_SUBB || op == CC_OP_SUBW || op == CC_OP_SUBL ||
            op == CC_OP_LOGIC) {
            tcond = TCG_COND_EQ;
            c->v1 = QREG_CC_N;
            goto done;
        }
        break;
    case 4: /* CC (!C) */
    case 5: /* CS (C) */
        /* Some cases fold C into X.  */
        if (op == CC_OP_ADDB || op == CC_OP_ADDW || op == CC_OP_ADDL ||
            op == CC_OP_SUBB || op == CC_OP_SUBW || op == CC_OP_SUBL) {
            tcond = TCG_COND_NE;
            c->v1 = QREG_CC_X;
            goto done;
        }
        /* fallthru */
    case 8: /* VC (!V) */
    case 9: /* VS (V) */
        /* Logic operations clear V and C.  */
        if (op == CC_OP_LOGIC) {
            tcond = TCG_COND_NEVER;
            c->v1 = c->v2;
            goto done;
        }
        break;
    }

    /* Otherwise, flush flag state to CC_OP_FLAGS.  */
    gen_flush_flags(s);

    switch (cond) {
    case 0: /* T */
    case 1: /* F */
    default:
        /* Invalid, or handled above.  */
        abort();
    case 2: /* HI (!C && !Z) -> !(C || Z)*/
    case 3: /* LS (C || Z) */
        c->v1 = tmp = tcg_temp_new(tcg_ctx);
        c->g1 = 0;
        tcg_gen_setcond_i32(tcg_ctx, TCG_COND_EQ, tmp, QREG_CC_Z, c->v2);
        tcg_gen_or_i32(tcg_ctx, tmp, tmp, QREG_CC_C);
        tcond = TCG_COND_NE;
        break;
    case 4: /* CC (!C) */
    case 5: /* CS (C) */
        c->v1 = QREG_CC_C;
        tcond = TCG_COND_NE;
        break;
    case 6: /* NE (!Z) */
    case 7: /* EQ (Z) */
        c->v1 = QREG_CC_Z;
        tcond = TCG_COND_EQ;
        break;
    case 8: /* VC (!V) */
    case 9: /* VS (V) */
        c->v1 = QREG_CC_V;
        tcond = TCG_COND_LT;
        break;
    case 10: /* PL (!N) */
    case 11: /* MI (N) */
        c->v1 = QREG_CC_N;
        tcond = TCG_COND_LT;
        break;
    case 12: /* GE (!(N ^ V)) */
    case 13: /* LT (N ^ V) */
        c->v1 = tmp = tcg_temp_new(tcg_ctx);
        c->g1 = 0;
        tcg_gen_xor_i32(tcg_ctx, tmp, QREG_CC_N, QREG_CC_V);
        tcond = TCG_COND_LT;
        break;
    case 14: /* GT (!(Z || (N ^ V))) */
    case 15: /* LE (Z || (N ^ V)) */
        c->v1 = tmp = tcg_temp_new(tcg_ctx);
        c->g1 = 0;
        tcg_gen_setcond_i32(tcg_ctx, TCG_COND_EQ, tmp, QREG_CC_Z, c->v2);
        tcg_gen_neg_i32(tcg_ctx, tmp, tmp);
        tmp2 = tcg_temp_new(tcg_ctx);
        tcg_gen_xor_i32(tcg_ctx, tmp2, QREG_CC_N, QREG_CC_V);
        tcg_gen_or_i32(tcg_ctx, tmp, tmp, tmp2);
        tcg_temp_free(tcg_ctx, tmp2);
        tcond = TCG_COND_LT;
        break;
    }

 done:
    if ((cond & 1) == 0) {
        tcond = tcg_invert_cond(tcond);
    }
    c->tcond = tcond;
}